

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O0

void __thiscall amount_tests::GetFeeTest::test_method(GetFeeTest *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe088;
  lazy_ostream *in_stack_ffffffffffffe090;
  char *in_stack_ffffffffffffe098;
  undefined4 in_stack_ffffffffffffe0a0;
  uint32_t in_stack_ffffffffffffe0a4;
  CFeeRate *in_stack_ffffffffffffe0a8;
  const_string *in_stack_ffffffffffffe0b0;
  const_string *msg;
  size_t in_stack_ffffffffffffe0b8;
  undefined1 *line_num;
  const_string *in_stack_ffffffffffffe0c0;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffe0c8;
  int maxInt;
  int largeNumber;
  GetFeeTest *this_local;
  const_string local_1630 [2];
  lazy_ostream local_1610 [2];
  unit_test_log_t local_15f0;
  CAmount local_15e8;
  assertion_result local_15e0;
  const_string local_15c8;
  undefined1 local_15b8 [16];
  const_string local_15a8 [2];
  lazy_ostream local_1588 [2];
  CAmount local_1560;
  assertion_result local_1558 [2];
  const_string local_1518 [2];
  lazy_ostream local_14f8 [2];
  CAmount local_14d0;
  assertion_result local_14c8 [2];
  const_string local_1490 [2];
  lazy_ostream local_1470 [2];
  CAmount local_1448;
  assertion_result local_1440 [2];
  const_string local_1400 [2];
  lazy_ostream local_13e0 [2];
  CAmount local_13c0;
  CAmount local_13b8;
  assertion_result local_13b0 [2];
  const_string local_1378 [2];
  lazy_ostream local_1358 [2];
  CAmount local_1338;
  CAmount local_1330;
  assertion_result local_1328 [2];
  const_string local_12f0 [2];
  lazy_ostream local_12d0 [2];
  CAmount local_12a8;
  assertion_result local_12a0 [2];
  const_string local_1268 [2];
  lazy_ostream local_1248 [2];
  CAmount local_1220;
  assertion_result local_1218 [2];
  const_string local_11e0 [2];
  lazy_ostream local_11c0 [2];
  CAmount local_1198;
  assertion_result local_1190 [2];
  const_string local_1158 [2];
  lazy_ostream local_1138 [2];
  CAmount local_1110;
  assertion_result local_1108 [2];
  const_string local_10d0 [2];
  lazy_ostream local_10b0 [2];
  CAmount local_1088;
  assertion_result local_1080 [2];
  const_string local_1048 [2];
  lazy_ostream local_1028 [2];
  CAmount local_1000;
  assertion_result local_ff8 [3];
  const_string local_fb0 [2];
  lazy_ostream local_f90 [2];
  undefined8 local_f68;
  assertion_result local_f58 [2];
  const_string local_f20 [2];
  lazy_ostream local_f00 [2];
  undefined8 local_ed8;
  assertion_result local_ec8 [2];
  const_string local_e90 [2];
  lazy_ostream local_e70 [2];
  undefined8 local_e48;
  assertion_result local_e38 [2];
  const_string local_e00 [2];
  lazy_ostream local_de0 [2];
  undefined8 local_db8;
  assertion_result local_da8 [2];
  const_string local_d70 [2];
  lazy_ostream local_d50 [2];
  undefined8 local_d28;
  assertion_result local_d18 [2];
  const_string local_ce0 [2];
  lazy_ostream local_cc0 [2];
  undefined8 local_c98;
  assertion_result local_c88 [2];
  const_string local_c50 [2];
  lazy_ostream local_c30 [2];
  undefined8 local_c08;
  assertion_result local_bf8 [2];
  const_string local_bc0 [2];
  lazy_ostream local_ba0 [2];
  undefined8 local_b78;
  assertion_result local_b68 [2];
  const_string local_b30 [2];
  lazy_ostream local_b10 [2];
  undefined8 local_ae8;
  assertion_result local_ad8 [2];
  const_string local_aa0 [2];
  lazy_ostream local_a80 [2];
  undefined8 local_a58;
  assertion_result local_a48 [2];
  lazy_ostream local_a10;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [64];
  CAmount local_9b0;
  CAmount local_9a8;
  lazy_ostream local_9a0;
  undefined1 local_990 [16];
  undefined1 local_980 [64];
  lazy_ostream local_940;
  undefined1 local_930 [16];
  undefined1 local_920 [64];
  lazy_ostream local_8e0;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [72];
  lazy_ostream local_878;
  undefined1 local_868 [16];
  undefined1 local_858 [64];
  lazy_ostream local_818;
  undefined1 local_808 [16];
  undefined1 local_7f8 [64];
  lazy_ostream local_7b8;
  undefined1 local_7a8 [16];
  undefined1 local_798 [64];
  lazy_ostream local_758;
  undefined1 local_748 [16];
  undefined1 local_738 [64];
  lazy_ostream local_6f8;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [64];
  lazy_ostream local_698;
  undefined1 local_688 [16];
  undefined1 local_678 [64];
  lazy_ostream local_638;
  undefined1 local_628 [16];
  undefined1 local_618 [64];
  lazy_ostream local_5d8;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [72];
  lazy_ostream local_570;
  undefined1 local_560 [16];
  undefined1 local_550 [64];
  lazy_ostream local_510;
  undefined1 local_500 [16];
  undefined1 local_4f0 [64];
  lazy_ostream local_4b0;
  undefined1 local_4a0 [16];
  undefined1 local_490 [64];
  lazy_ostream local_450;
  undefined1 local_440 [16];
  undefined1 local_430 [64];
  lazy_ostream local_3f0;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [64];
  lazy_ostream local_390;
  undefined1 local_380 [16];
  undefined1 local_370 [72];
  lazy_ostream local_328;
  undefined1 local_318 [16];
  undefined1 local_308 [64];
  lazy_ostream local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [64];
  lazy_ostream local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [64];
  lazy_ostream local_208;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [64];
  lazy_ostream local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [64];
  lazy_ostream local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [72];
  lazy_ostream local_e0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [64];
  lazy_ostream local_80;
  undefined1 local_70 [16];
  undefined1 local_60 [72];
  CFeeRate altFeeRate;
  CFeeRate feeRate;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffe088);
  CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffe088);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_80._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_80._vptr_lazy_ostream = (_func_int **)0x0;
    in_stack_ffffffffffffe098 = "CAmount(0)";
    in_stack_ffffffffffffe090 = &local_80;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_60,local_70,0x1d,1,2,&local_80.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_e0._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_e0._vptr_lazy_ostream = (_func_int **)0x0;
    in_stack_ffffffffffffe098 = "CAmount(0)";
    in_stack_ffffffffffffe090 = &local_e0;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(1e5)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_c0,local_d0,0x1e,1,2,&local_e0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_148._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_148._vptr_lazy_ostream = (_func_int **)0x0;
    in_stack_ffffffffffffe098 = "CAmount(0)";
    in_stack_ffffffffffffe090 = &local_148;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_128,local_138,0x22,1,2,&local_148.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_1a8._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_1a8._vptr_lazy_ostream = (_func_int **)0x1;
    in_stack_ffffffffffffe098 = "CAmount(1)";
    in_stack_ffffffffffffe090 = &local_1a8;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_188,local_198,0x23,1,2,&local_1a8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_208._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_208._vptr_lazy_ostream = (_func_int **)0x79;
    in_stack_ffffffffffffe098 = "CAmount(121)";
    in_stack_ffffffffffffe090 = &local_208;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(121)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1e8,local_1f8,0x24,1,2,&local_208.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_268._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_268._vptr_lazy_ostream = (_func_int **)0x3e7;
    in_stack_ffffffffffffe098 = "CAmount(999)";
    in_stack_ffffffffffffe090 = &local_268;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(999)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_248,local_258,0x25,1,2,&local_268.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_2c8._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_2c8._vptr_lazy_ostream = (_func_int **)0x3e8;
    in_stack_ffffffffffffe098 = "CAmount(1e3)";
    in_stack_ffffffffffffe090 = &local_2c8;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(1e3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_2a8,local_2b8,0x26,1,2,&local_2c8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_328._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_328._vptr_lazy_ostream = (_func_int **)0x2328;
    in_stack_ffffffffffffe098 = "CAmount(9e3)";
    in_stack_ffffffffffffe090 = &local_328;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(9e3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_308,local_318,0x27,1,2,&local_328.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_390._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_390._vptr_lazy_ostream = (_func_int **)0x0;
    in_stack_ffffffffffffe098 = "CAmount(0)";
    in_stack_ffffffffffffe090 = &local_390;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_370,local_380,0x2b,1,2,&local_390.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_3f0._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_3f0._vptr_lazy_ostream = (_func_int **)0xffffffffffffffff;
    in_stack_ffffffffffffe098 = "CAmount(-1)";
    in_stack_ffffffffffffe090 = &local_3f0;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_3d0,local_3e0,0x2c,1,2,&local_3f0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_450._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_450._vptr_lazy_ostream = (_func_int **)0xffffffffffffff87;
    in_stack_ffffffffffffe098 = "CAmount(-121)";
    in_stack_ffffffffffffe090 = &local_450;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(121)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_430,local_440,0x2d,1,2,&local_450.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_4b0._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_4b0._vptr_lazy_ostream = (_func_int **)0xfffffffffffffc19;
    in_stack_ffffffffffffe098 = "CAmount(-999)";
    in_stack_ffffffffffffe090 = &local_4b0;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(999)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_490,local_4a0,0x2e,1,2,&local_4b0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_510._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_510._vptr_lazy_ostream = (_func_int **)0xfffffffffffffc18;
    in_stack_ffffffffffffe098 = "CAmount(-1e3)";
    in_stack_ffffffffffffe090 = &local_510;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(1e3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_4f0,local_500,0x2f,1,2,&local_510.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_570._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_570._vptr_lazy_ostream = (_func_int **)0xffffffffffffdcd8;
    in_stack_ffffffffffffe098 = "CAmount(-9e3)";
    in_stack_ffffffffffffe090 = &local_570;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(9e3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_550,local_560,0x30,1,2,&local_570.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_5d8._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_5d8._vptr_lazy_ostream = (_func_int **)0x0;
    in_stack_ffffffffffffe098 = "CAmount(0)";
    in_stack_ffffffffffffe090 = &local_5d8;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_5b8,local_5c8,0x34,1,2,&local_5d8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_638._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_638._vptr_lazy_ostream = (_func_int **)0x1;
    in_stack_ffffffffffffe098 = "CAmount(1)";
    in_stack_ffffffffffffe090 = &local_638;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(8)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_618,local_628,0x35,1,2,&local_638.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_698._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_698._vptr_lazy_ostream = (_func_int **)0x2;
    in_stack_ffffffffffffe098 = "CAmount(2)";
    in_stack_ffffffffffffe090 = &local_698;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(9)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_678,local_688,0x36,1,2,&local_698.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_6f8._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_6f8._vptr_lazy_ostream = (_func_int **)0xf;
    in_stack_ffffffffffffe098 = "CAmount(15)";
    in_stack_ffffffffffffe090 = &local_6f8;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(121)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_6d8,local_6e8,0x37,1,2,&local_6f8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_758._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_758._vptr_lazy_ostream = (_func_int **)0x10;
    in_stack_ffffffffffffe098 = "CAmount(16)";
    in_stack_ffffffffffffe090 = &local_758;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(122)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_738,local_748,0x38,1,2,&local_758.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_7b8._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_7b8._vptr_lazy_ostream = (_func_int **)0x7b;
    in_stack_ffffffffffffe098 = "CAmount(123)";
    in_stack_ffffffffffffe090 = &local_7b8;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(999)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_798,local_7a8,0x39,1,2,&local_7b8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_818._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_818._vptr_lazy_ostream = (_func_int **)0x7b;
    in_stack_ffffffffffffe098 = "CAmount(123)";
    in_stack_ffffffffffffe090 = &local_818;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(1e3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_7f8,local_808,0x3a,1,2,&local_818.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_878._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_878._vptr_lazy_ostream = (_func_int **)0x453;
    in_stack_ffffffffffffe098 = "CAmount(1107)";
    in_stack_ffffffffffffe090 = &local_878;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(9e3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_858,local_868,0x3b,1,2,&local_878.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_8e0._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_8e0._vptr_lazy_ostream = (_func_int **)0x0;
    in_stack_ffffffffffffe098 = "CAmount(0)";
    in_stack_ffffffffffffe090 = &local_8e0;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_8c0,local_8d0,0x3f,1,2,&local_8e0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_940._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_940._vptr_lazy_ostream = (_func_int **)0xffffffffffffffff;
    in_stack_ffffffffffffe098 = "CAmount(-1)";
    in_stack_ffffffffffffe090 = &local_940;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(8)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_920,local_930,0x40,1,2,&local_940.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_9a0._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_9a0._vptr_lazy_ostream = (_func_int **)0xffffffffffffffff;
    in_stack_ffffffffffffe098 = "CAmount(-1)";
    in_stack_ffffffffffffe090 = &local_9a0;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(9)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_980,local_990,0x41,1,2,&local_9a0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  local_9b0 = local_9a8;
  altFeeRate.nSatoshisPerK = local_9a8;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe090,(char (*) [1])in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    local_a10._8_8_ = CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    local_a10._vptr_lazy_ostream =
         (_func_int **)CFeeRate::GetFee(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a4);
    in_stack_ffffffffffffe098 = "altFeeRate.GetFee(100)";
    in_stack_ffffffffffffe090 = &local_a10;
    in_stack_ffffffffffffe088 = "feeRate.GetFee(100)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_9f0,local_a00,0x46,1,2,&local_a10.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_a58 = 0xffffffffffffffff;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a48,local_a80,local_aa0,0x49,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_ae8 = 0;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ad8,local_b10,local_b30,0x4a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_b78 = 1;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b68,local_ba0,local_bc0,0x4b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_c08 = 0xffffffffffffffff;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bf8,local_c30,local_c50,0x4d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_c98 = 0;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c88,local_cc0,local_ce0,0x4e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_d28 = 1;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d18,local_d50,local_d70,0x4f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_db8 = 1;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_da8,local_de0,local_e00,0x51,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_e48 = 2;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e38,local_e70,local_e90,0x52,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_ed8 = 0x1a;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ec8,local_f00,local_f20,0x54,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_f68 = 0x1b;
    CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                       (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                       (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f58,local_f90,local_fb0,0x55,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::numeric_limits<unsigned_int>::max();
  CFeeRate::CFeeRate(in_stack_ffffffffffffe0a8,
                     (CAmount *)CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                     (uint32_t)((ulong)in_stack_ffffffffffffe098 >> 0x20));
  CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffe088);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_1000 = (CAmount)::operator*((int)((ulong)in_stack_ffffffffffffe090 >> 0x20),
                                      (CFeeRate *)in_stack_ffffffffffffe088);
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ff8,local_1028,local_1048,0x5c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_1088 = (CAmount)::operator*((CFeeRate *)in_stack_ffffffffffffe090,
                                      (int)((ulong)in_stack_ffffffffffffe088 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1080,local_10b0,local_10d0,0x5d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_1110 = (CAmount)::operator*((int)((ulong)in_stack_ffffffffffffe090 >> 0x20),
                                      (CFeeRate *)in_stack_ffffffffffffe088);
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1108,local_1138,local_1158,0x5f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_1198 = (CAmount)::operator*((CFeeRate *)in_stack_ffffffffffffe090,
                                      (int)((ulong)in_stack_ffffffffffffe088 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1190,local_11c0,local_11e0,0x60,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_1220 = (CAmount)::operator*((int)((ulong)in_stack_ffffffffffffe090 >> 0x20),
                                      (CFeeRate *)in_stack_ffffffffffffe088);
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1218,local_1248,local_1268,0x62,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_12a8 = (CAmount)::operator*((CFeeRate *)in_stack_ffffffffffffe090,
                                      (int)((ulong)in_stack_ffffffffffffe088 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_12a0,local_12d0,local_12f0,99,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_1330 = (CAmount)::operator*((int)((ulong)in_stack_ffffffffffffe090 >> 0x20),
                                      (CFeeRate *)in_stack_ffffffffffffe088);
    local_1338 = (CAmount)::operator*((CFeeRate *)in_stack_ffffffffffffe090,
                                      (int)((ulong)in_stack_ffffffffffffe088 >> 0x20));
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1328,local_1358,local_1378,0x65,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_13b8 = (CAmount)::operator*((int)((ulong)in_stack_ffffffffffffe090 >> 0x20),
                                      (CFeeRate *)in_stack_ffffffffffffe088);
    local_13c0 = (CAmount)::operator*((CFeeRate *)in_stack_ffffffffffffe090,
                                      (int)((ulong)in_stack_ffffffffffffe088 >> 0x20));
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13b0,local_13e0,local_1400,0x68,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::numeric_limits<int>::max();
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_1448 = (CAmount)::operator*((CFeeRate *)in_stack_ffffffffffffe090,
                                      (int)((ulong)in_stack_ffffffffffffe088 >> 0x20));
    CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffe088,0x364c5d);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1440,local_1470,local_1490,0x6c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_14d0 = (CAmount)::operator*((int)((ulong)in_stack_ffffffffffffe090 >> 0x20),
                                      (CFeeRate *)in_stack_ffffffffffffe088);
    CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffe088,0x364de4);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14c8,local_14f8,local_1518,0x6d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
               in_stack_ffffffffffffe0b0);
    local_1560 = (CAmount)::operator*((CFeeRate *)in_stack_ffffffffffffe090,
                                      (int)((ulong)in_stack_ffffffffffffe088 >> 0x20));
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1558,local_1588,local_15a8,0x70,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    line_num = local_15b8;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    file = &local_15c8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe0c8,file,(size_t)line_num,msg);
    local_15e8 = (CAmount)::operator*((int)((ulong)in_stack_ffffffffffffe090 >> 0x20),
                                      (CFeeRate *)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe0c8 = &local_15f0;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffe088,0);
    ::operator==((CFeeRate *)in_stack_ffffffffffffe098,(CFeeRate *)in_stack_ffffffffffffe090);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe098,
               SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe090,(basic_cstring<const_char> *)in_stack_ffffffffffffe088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe098,
               (pointer)in_stack_ffffffffffffe090,(unsigned_long)in_stack_ffffffffffffe088);
    in_stack_ffffffffffffe088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_15e0,local_1610,local_1630,0x71,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe088);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(GetFeeTest)
{
    CFeeRate feeRate, altFeeRate;

    feeRate = CFeeRate(0);
    // Must always return 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e5), CAmount(0));

    feeRate = CFeeRate(1000);
    // Must always just return the arg
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1), CAmount(1));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(121));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(999));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(1e3));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(9e3));

    feeRate = CFeeRate(-1000);
    // Must always just return -1 * arg
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1), CAmount(-1));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(-121));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(-999));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(-1e3));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(-9e3));

    feeRate = CFeeRate(123);
    // Rounds up the result, if not integer
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(8), CAmount(1)); // Special case: returns 1 instead of 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(9), CAmount(2));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(15));
    BOOST_CHECK_EQUAL(feeRate.GetFee(122), CAmount(16));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(123));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(123));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(1107));

    feeRate = CFeeRate(-123);
    // Truncates the result, if not integer
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(8), CAmount(-1)); // Special case: returns -1 instead of 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(9), CAmount(-1));

    // check alternate constructor
    feeRate = CFeeRate(1000);
    altFeeRate = CFeeRate(feeRate);
    BOOST_CHECK_EQUAL(feeRate.GetFee(100), altFeeRate.GetFee(100));

    // Check full constructor
    BOOST_CHECK(CFeeRate(CAmount(-1), 0) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(0), 0) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(1), 0) == CFeeRate(0));
    // default value
    BOOST_CHECK(CFeeRate(CAmount(-1), 1000) == CFeeRate(-1));
    BOOST_CHECK(CFeeRate(CAmount(0), 1000) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(1), 1000) == CFeeRate(1));
    // lost precision (can only resolve satoshis per kB)
    BOOST_CHECK(CFeeRate(CAmount(1), 1001) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(2), 1001) == CFeeRate(1));
    // some more integer checks
    BOOST_CHECK(CFeeRate(CAmount(26), 789) == CFeeRate(32));
    BOOST_CHECK(CFeeRate(CAmount(27), 789) == CFeeRate(34));
    // Maximum size in bytes, should not crash
    CFeeRate(MAX_MONEY, std::numeric_limits<uint32_t>::max()).GetFeePerK();

    // check multiplication operator
    // check multiplying by zero
    feeRate = CFeeRate(1000);
    BOOST_CHECK(0 * feeRate == CFeeRate(0));
    BOOST_CHECK(feeRate * 0 == CFeeRate(0));
    // check multiplying by a positive integer
    BOOST_CHECK(3 * feeRate == CFeeRate(3000));
    BOOST_CHECK(feeRate * 3 == CFeeRate(3000));
    // check multiplying by a negative integer
    BOOST_CHECK(-3 * feeRate == CFeeRate(-3000));
    BOOST_CHECK(feeRate * -3 == CFeeRate(-3000));
    // check commutativity
    BOOST_CHECK(2 * feeRate == feeRate * 2);
    // check with large numbers
    int largeNumber = 1000000;
    BOOST_CHECK(largeNumber * feeRate == feeRate * largeNumber);
    // check boundary values
    int maxInt = std::numeric_limits<int>::max();
    feeRate = CFeeRate(maxInt);
    BOOST_CHECK(feeRate * 2 == CFeeRate(static_cast<int64_t>(maxInt) * 2));
    BOOST_CHECK(2 * feeRate == CFeeRate(static_cast<int64_t>(maxInt) * 2));
    // check with zero fee rate
    feeRate = CFeeRate(0);
    BOOST_CHECK(feeRate * 5 == CFeeRate(0));
    BOOST_CHECK(5 * feeRate == CFeeRate(0));
}